

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::BareToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  Location loc;
  int iVar1;
  int iVar2;
  undefined4 uStack_c;
  
  iVar2 = (*(int *)&this->token_start_ - *(int *)&this->line_start_) + 1;
  if (iVar2 < 2) {
    iVar2 = 1;
  }
  iVar1 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
  if (iVar1 < 2) {
    iVar1 = 1;
  }
  loc.field_1.field_0.first_column = iVar2;
  loc.field_1.field_0.line = this->line_;
  loc.field_1._12_4_ = uStack_c;
  loc.field_1.field_0.last_column = iVar1;
  loc.filename._M_str = (this->filename_)._M_dataplus._M_p;
  loc.filename._M_len = (this->filename_)._M_string_length;
  Token::Token(__return_storage_ptr__,loc,token_type);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::BareToken(TokenType token_type) {
  return Token(GetLocation(), token_type);
}